

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

bool __thiscall Application::queryConfirm(Application *this,string *query)

{
  char *pcVar1;
  int iVar2;
  ostream *poVar3;
  string value;
  char *local_38;
  undefined8 local_30;
  char local_28;
  undefined7 uStack_27;
  
  local_30 = 0;
  local_28 = '\0';
  local_38 = &local_28;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  poVar3 = (ostream *)std::ostream::flush();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(query->_M_dataplus)._M_p,query->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"?: ",3);
  std::operator>>((istream *)&std::cin,(string *)&local_38);
  pcVar1 = local_38;
  iVar2 = toupper((int)*local_38);
  if (pcVar1 != &local_28) {
    operator_delete(pcVar1,CONCAT71(uStack_27,local_28) + 1);
  }
  return iVar2 == 0x59;
}

Assistant:

bool Application::queryConfirm(const std::string &query) {
  std::string value;
  std::cout << std::endl << query << "?: ";
  std::cin >> value;
  return toupper(*value.c_str()) == 'Y';
}